

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O1

Am_Value Am_Get_Label_Or_ID_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  Am_Object cmd;
  Am_Object AStack_28;
  Am_Object local_20;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0xc5,1);
  Am_Value::operator=((Am_Value *)self,pAVar2);
  aVar3 = extraout_RDX;
  if (*(short *)&self->data == -0x5fff) {
    Am_Object::Am_Object(&AStack_28,(Am_Value *)self);
    Am_Object::Am_Object(&local_20,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&AStack_28,&local_20);
    Am_Object::~Am_Object(&local_20);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&AStack_28,0x153,1);
      Am_Value::operator=((Am_Value *)self,pAVar2);
      bVar1 = Am_Value::Valid((Am_Value *)self);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(&AStack_28,0x150,1);
        Am_Value::operator=((Am_Value *)self,pAVar2);
      }
    }
    Am_Object::~Am_Object(&AStack_28);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, Am_Get_Label_Or_ID)
{
  Am_Value value;
  //return will be set into value
  value = self.Peek(Am_COMMAND);
  if (value.type == Am_OBJECT) {
    Am_Object cmd = value;
    if (cmd.Is_Instance_Of(Am_Command)) {
      value = cmd.Peek(Am_ID);
      if (!value.Valid())
        value = cmd.Peek(Am_LABEL); //if no ID, then use the label
    }
  }
  //otherwise, value is already set with the correct value to use
  //Note: can't use Am_REAL_STRING_OR_OBJ since it converts values
  //into a string
  return value;
}